

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O2

void accumulate(int *xs,int *ys,size_t n,inform_dist *x,inform_dist *y)

{
  size_t i;
  size_t sVar1;
  
  x->counts = n;
  y->counts = n;
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    x->histogram[xs[sVar1]] = x->histogram[xs[sVar1]] + 1;
    y->histogram[ys[sVar1]] = y->histogram[ys[sVar1]] + 1;
  }
  return;
}

Assistant:

inline static void accumulate(int const *xs, int const *ys, size_t n, int by,
    inform_dist *x, inform_dist *xy)
{
    x->counts = n;
    xy->counts = n;

    for (size_t i = 0; i < n; ++i)
    {
        x->histogram[xs[i]]++;
        xy->histogram[xs[i]*by + ys[i]]++;
    }
}